

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode set_userpass(connectdata *conn,char *user,char *passwd)

{
  char *pcVar1;
  CURLcode CVar2;
  
  if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd != false)) {
    pcVar1 = (*Curl_cstrdup)(user);
    conn->user = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(passwd);
      goto LAB_0011ea20;
    }
  }
  else {
    pcVar1 = (*Curl_cstrdup)("anonymous");
    conn->user = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)("ftp@example.com");
      goto LAB_0011ea20;
    }
  }
  pcVar1 = (char *)0x0;
LAB_0011ea20:
  conn->passwd = pcVar1;
  CVar2 = CURLE_OK;
  if (pcVar1 == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  if (conn->user == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  return CVar2;
}

Assistant:

static CURLcode set_userpass(struct connectdata *conn,
                             const char *user, const char *passwd)
{
  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) &&
     !conn->bits.user_passwd) {

    conn->user = strdup(CURL_DEFAULT_USER);
    if(conn->user)
      conn->passwd = strdup(CURL_DEFAULT_PASSWORD);
    else
      conn->passwd = NULL;
    /* This is the default password, so DON'T set conn->bits.user_passwd */
  }
  else {
    /* store user + password, zero-length if not set */
    conn->user = strdup(user);
    if(conn->user)
      conn->passwd = strdup(passwd);
    else
      conn->passwd = NULL;
  }
  if(!conn->user || !conn->passwd)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}